

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_edit_commands_list_undo_proc(Am_Object *cmd)

{
  Am_Slot_Key AVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object execute_command;
  Am_Object script_window;
  Am_Value_List cur_orig_cmds;
  Am_Value_List old_orig_cmds;
  Am_Value_List old_original_command_list;
  Am_Value_List cur_original_command_list;
  Am_Object local_80;
  Am_Object local_78;
  Am_Value_List local_70;
  Am_Value_List local_60;
  Am_Value_List local_50;
  Am_Value_List local_40;
  Am_Value_List local_30;
  
  Am_Object::Get_Object((Am_Object *)&local_60,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_78,(Am_Slot_Key)&local_60,10);
  Am_Object::~Am_Object((Am_Object *)&local_60);
  pAVar2 = Am_Object::Get(&local_78,Am_SCRIPT_EXECUTE_COMMAND,0);
  Am_Object::Am_Object(&local_80,pAVar2);
  pAVar2 = Am_Object::Get(&local_80,Am_COMMANDS_PROTOTYPES,0);
  Am_Value_List::Am_Value_List(&local_60,pAVar2);
  pAVar2 = Am_Object::Get(&local_80,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List(&local_30,pAVar2);
  pAVar2 = Am_Object::Get(cmd,0x16c,0);
  Am_Value_List::Am_Value_List(&local_50,pAVar2);
  pAVar2 = Am_Object::Get(cmd,Am_ORIGINAL_COMMAND_LIST,0);
  Am_Value_List::Am_Value_List(&local_40,pAVar2);
  Am_Value_List::Copy(&local_70);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(cmd,0x16c,pAVar3,0);
  Am_Value_List::~Am_Value_List(&local_70);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  Am_Value_List::Copy(&local_70);
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set(cmd,AVar1,pAVar3,0);
  Am_Value_List::~Am_Value_List(&local_70);
  renumber_script_commands(&local_50);
  AVar1 = Am_COMMANDS_PROTOTYPES;
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Object::Set(&local_80,AVar1,pAVar3,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_50);
  Am_Object::Set(&local_80,AVar1,pAVar3,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar3 = Am_Value_List::operator_cast_to_Am_Wrapper_(&local_40);
  Am_Object::Set(&local_80,AVar1,pAVar3,0);
  am_set_commands_into_script_window(&local_78,&local_80);
  Am_Value_List::~Am_Value_List(&local_40);
  Am_Value_List::~Am_Value_List(&local_50);
  Am_Value_List::~Am_Value_List(&local_30);
  Am_Value_List::~Am_Value_List(&local_60);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_edit_commands_list_undo,
                 (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object execute_command = script_window.Get(Am_SCRIPT_EXECUTE_COMMAND);
  Am_Value_List cur_orig_cmds = execute_command.Get(Am_COMMANDS_PROTOTYPES);
  Am_Value_List cur_original_command_list =
      execute_command.Get(Am_ORIGINAL_COMMAND_LIST);

  Am_Value_List old_orig_cmds = cmd.Get(Am_OLD_VALUE);
  Am_Value_List old_original_command_list = cmd.Get(Am_ORIGINAL_COMMAND_LIST);

  //in case undo the undo
  cmd.Set(Am_OLD_VALUE, cur_orig_cmds.Copy());
  cmd.Set(Am_ORIGINAL_COMMAND_LIST, cur_original_command_list.Copy());

  renumber_script_commands(old_orig_cmds);
  execute_command.Set(Am_COMMANDS_PROTOTYPES, old_orig_cmds);
  execute_command.Set(Am_COMMANDS_IN_SCRIPT, old_orig_cmds);
  execute_command.Set(Am_ORIGINAL_COMMAND_LIST, old_original_command_list);
  am_set_commands_into_script_window(script_window, execute_command);
}